

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_7995ed::StretchedAYPair::apply_samples<(Outputs::Speaker::Action)1>
          (StretchedAYPair *this,size_t number_of_samples,StereoSample *target)

{
  int iVar1;
  uint uVar2;
  size_t c;
  size_t sVar3;
  StereoSample local_2c;
  
  for (sVar3 = 0; number_of_samples != sVar3; sVar3 = sVar3 + 1) {
    iVar1 = this->subdivider_ + 1;
    this->subdivider_ = iVar1;
    if (iVar1 == 0x1c) {
      uVar2 = this->phase_ + 1;
      this->phase_ = uVar2;
      this->subdivider_ = -(uint)((uVar2 & 0xf) == 0);
      if (uVar2 == 0x41) {
        this->phase_ = 0;
      }
      Apple::II::AYPair::advance(&this->super_AYPair);
    }
    Apple::II::AYPair::level((AYPair *)&local_2c);
    target[sVar3] = local_2c;
  }
  return;
}

Assistant:

void apply_samples(std::size_t number_of_samples, Outputs::Speaker::StereoSample *target) {

			// (1) take 64 windows of 7 input cycles followed by one window of 8 input cycles;
			// (2) after each four windows, advance the underlying AY.
			//
			// i.e. advance after:
			//
			//	* 28 cycles, {16 times, then 15 times, then 15 times, then 15 times};
			//	* 29 cycles, once.
			//
			// so:
			//	16, 1;	15, 1;	15, 1;	15, 1
			//
			// i.e. add an extra one on the 17th, 33rd, 49th and 65th ticks in a 65-tick loop.
			for(std::size_t c = 0; c < number_of_samples; c++) {
				++subdivider_;
				if(subdivider_ == 28) {
					++phase_;
					subdivider_ = (phase_ & 15) ? 0 : -1;
					if(phase_ == 65) phase_ = 0;

					advance();
				}

				target[c] = level();
			}
		}